

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::CPrimitiveMode::CPrimitiveMode
          (CPrimitiveMode *this,TDrawFunction drawFunc,GLenum primitiveType,uint sizeX,uint sizeY)

{
  DrawIndirectBase::DrawIndirectBase(&this->super_DrawIndirectBase);
  (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01ddf3b0;
  this->_drawFunc = drawFunc;
  this->_primitiveType = primitiveType;
  this->_drawSizeX = sizeX;
  this->_drawSizeY = sizeY;
  this->_sizeX = 0;
  this->_sizeY = 0;
  this->_program = 0;
  this->_vao = 0;
  this->_vao = 0;
  this->_buffer = 0;
  this->_ebo = 0;
  this->_bufferIndirect = 0;
  return;
}

Assistant:

CPrimitiveMode(TDrawFunction drawFunc, GLenum primitiveType, unsigned int sizeX = -1, unsigned sizeY = -1)
		: _drawFunc(drawFunc)
		, _primitiveType(primitiveType)
		, _drawSizeX(sizeX)
		, _drawSizeY(sizeY)
		, _sizeX(0)
		, _sizeY(0)
		, _program(0)
		, _vao(0)
		, _buffer(0)
		, _ebo(0)
		, _bufferIndirect(0)
	{
	}